

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  void *in_R8;
  size_t in_R9;
  BYTE *in_stack_00000018;
  FSE_CTable *in_stack_00000020;
  undefined4 in_stack_00000028;
  FSE_CTable *in_stack_00000100;
  BYTE *in_stack_00000108;
  seqDef *in_stack_00000110;
  size_t in_stack_00000118;
  int in_stack_00000120;
  undefined4 in_stack_ffffffffffffffac;
  FSE_CTable *in_stack_ffffffffffffffb0;
  undefined8 local_18;
  
  if ((int)ofCodeTable == 0) {
    local_18 = ZSTD_encodeSequences_default
                         (in_R8,in_R9,in_stack_ffffffffffffffb0,
                          (BYTE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_00000028),
                          in_stack_00000020,in_stack_00000018,in_stack_00000100,in_stack_00000108,
                          in_stack_00000110,in_stack_00000118,in_stack_00000120);
  }
  else {
    local_18 = ZSTD_encodeSequences_bmi2
                         (in_R8,in_R9,in_stack_ffffffffffffffb0,
                          (BYTE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_00000028),
                          in_stack_00000020,in_stack_00000018,in_stack_00000100,in_stack_00000108,
                          in_stack_00000110,in_stack_00000118,in_stack_00000120);
  }
  return local_18;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}